

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotations.cpp
# Opt level: O0

SubFrame * __thiscall ezc3d::DataNS::RotationNS::Rotations::subframe(Rotations *this,size_t idx)

{
  reference pvVar1;
  vector<ezc3d::DataNS::RotationNS::SubFrame,_std::allocator<ezc3d::DataNS::RotationNS::SubFrame>_>
  *in_RDI;
  out_of_range *anon_var_0;
  size_type in_stack_fffffffffffffef8;
  
  pvVar1 = std::
           vector<ezc3d::DataNS::RotationNS::SubFrame,_std::allocator<ezc3d::DataNS::RotationNS::SubFrame>_>
           ::at(in_RDI,in_stack_fffffffffffffef8);
  return pvVar1;
}

Assistant:

ezc3d::DataNS::RotationNS::SubFrame &
ezc3d::DataNS::RotationNS::Rotations::subframe(size_t idx) {
  try {
    return _subframe.at(idx);
  } catch (const std::out_of_range&) {
    throw std::out_of_range(
        "Analogs::subframe method is trying to access the subframe " +
        std::to_string(idx) + " while the maximum number of subframes is " +
        std::to_string(nbSubframes()) + ".");
  }
}